

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call.hpp
# Opt level: O0

Result_Type *
chaiscript::detail::
Cast_Helper<std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_>::cast
          (Boxed_Value *ob,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  Type_Info *ti;
  Type_Conversions_State *in_RSI;
  Result_Type *in_RDI;
  Type_Info *in_stack_ffffffffffffffd0;
  Boxed_Value *in_stack_ffffffffffffffd8;
  Result_Type *bv;
  
  bv = in_RDI;
  ti = Boxed_Value::get_type_info((Boxed_Value *)0x33d8e9);
  user_type<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>();
  bVar1 = Type_Info::bare_equal(in_stack_ffffffffffffffd0,ti);
  if (bVar1) {
    chaiscript::dispatch::functor<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>
              ((Boxed_Value *)bv,in_RSI);
  }
  else {
    Cast_Helper_Inner<std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_>::
    cast(in_stack_ffffffffffffffd8,(Type_Conversions_State *)in_stack_ffffffffffffffd0);
  }
  return in_RDI;
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *t_conversions)
        {
          if (ob.get_type_info().bare_equal(user_type<Const_Proxy_Function>()))
          {
            return dispatch::functor<Signature>(ob, t_conversions);
          } else {
            return Cast_Helper_Inner<std::function<Signature> >::cast(ob, t_conversions);
          }
        }